

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint16_t *puVar4;
  shared_container_t *container;
  void **ppvVar5;
  void *pvVar6;
  int iVar7;
  ushort *puVar8;
  byte type2;
  ushort uVar9;
  int *piVar10;
  uint uVar11;
  ushort *puVar12;
  undefined8 *c2;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint8_t uVar16;
  int iVar17;
  uint uVar18;
  uint32_t end;
  uint32_t new_begin;
  uint32_t begin;
  uint8_t result_type;
  uint8_t local_51 [9];
  int *local_48;
  uint32_t local_40;
  uint32_t local_3c;
  roaring_array_t *local_38;
  
  local_51[0] = '\0';
  uVar2 = (x2->high_low_container).size;
  if (uVar2 == 0) {
    return;
  }
  end = (x1->high_low_container).size;
  if (end == 0) {
    ra_reset(&x1->high_low_container);
    return;
  }
  puVar8 = (x1->high_low_container).keys;
  uVar9 = *(x2->high_low_container).keys;
  uVar14 = 0;
  begin = 0;
  new_begin = 0;
  puVar12 = puVar8;
LAB_00106c26:
  do {
    uVar1 = *puVar12;
    while (uVar1 != uVar9) {
      if (uVar1 < uVar9) {
        if (begin != new_begin) {
          ppvVar5 = (x1->high_low_container).containers;
          uVar16 = (x1->high_low_container).typecodes[begin & 0xffff];
          pvVar6 = ppvVar5[begin & 0xffff];
          puVar8[(int)new_begin] = uVar1;
          ppvVar5[(int)new_begin] = pvVar6;
          (x1->high_low_container).typecodes[(int)new_begin] = uVar16;
        }
        new_begin = new_begin + 1;
        begin = begin + 1;
        if (begin == end) goto LAB_00106f79;
        puVar8 = (x1->high_low_container).keys;
        puVar12 = puVar8 + (begin & 0xffff);
        goto LAB_00106c26;
      }
      uVar3 = (x2->high_low_container).size;
      puVar4 = (x2->high_low_container).keys;
      uVar18 = uVar14 + 1;
      uVar11 = uVar18;
      if (((int)uVar18 < (int)uVar3) && (puVar4[(int)uVar18] < uVar1)) {
        uVar14 = uVar14 + 2;
        iVar17 = 1;
        if ((int)uVar14 < (int)uVar3) {
          iVar17 = 1;
          do {
            uVar15 = (ulong)uVar14;
            uVar9 = puVar4[(int)uVar14];
            if (uVar1 <= uVar9) goto LAB_00106c8e;
            iVar7 = iVar17 * 2;
            uVar14 = uVar18 + iVar17 * 2;
            iVar17 = iVar7;
          } while ((int)uVar14 < (int)uVar3);
        }
        uVar9 = puVar4[(long)(int)uVar3 + -1];
        uVar15 = (long)(int)uVar3 - 1;
LAB_00106c8e:
        uVar14 = (uint)uVar15;
        uVar11 = uVar14;
        if (((uVar9 != uVar1) && (uVar11 = uVar3, uVar1 <= uVar9)) &&
           (uVar11 = uVar14, (iVar17 >> 1) + uVar18 + 1 != uVar14)) {
          uVar18 = (iVar17 >> 1) + uVar18;
          do {
            uVar11 = (int)(uVar18 + (uint)uVar15) >> 1;
            if (puVar4[(int)uVar11] == uVar1) break;
            uVar14 = uVar11;
            if (puVar4[(int)uVar11] < uVar1) {
              uVar14 = (uint)uVar15;
              uVar18 = uVar11;
            }
            uVar15 = (ulong)uVar14;
            uVar11 = uVar14;
          } while (uVar18 + 1 != uVar14);
        }
      }
      if (uVar11 == uVar2) goto LAB_00106f52;
      uVar14 = uVar11;
      uVar9 = puVar4[uVar11 & 0xffff];
    }
    uVar15 = (ulong)(uVar14 & 0xffff);
    container = (shared_container_t *)(x1->high_low_container).containers[begin & 0xffff];
    type2 = (x2->high_low_container).typecodes[uVar15];
    c2 = (undefined8 *)(x2->high_low_container).containers[uVar15];
    local_40 = new_begin;
    local_3c = end;
    local_38 = &x1->high_low_container;
    if ((x1->high_low_container).typecodes[begin & 0xffff] != 4) {
      if (type2 == 4) {
        type2 = *(byte *)(c2 + 1);
        c2 = (undefined8 *)*c2;
      }
      local_51[1] = '\0';
      local_51[2] = '\0';
      local_51[3] = '\0';
      local_51[4] = '\0';
      local_51[5] = '\0';
      local_51[6] = '\0';
      local_51[7] = '\0';
      local_51[8] = '\0';
      (*(code *)(&DAT_0011f1c8 +
                *(int *)(&DAT_0011f1c8 +
                        (ulong)(((uint)type2 +
                                (uint)(x1->high_low_container).typecodes[begin & 0xffff] * 4) - 5) *
                        4)))(container,uVar15,c2);
      return;
    }
    local_48 = (int *)container_andnot(container,'\x04',c2,type2,local_51);
    shared_container_free(container);
    x1 = (roaring_bitmap_t *)local_38;
    end = local_3c;
    piVar10 = local_48;
    uVar16 = local_51[0];
    if (local_51[0] == '\x04') {
      uVar16 = (uint8_t)local_48[2];
      piVar10 = *(int **)local_48;
    }
    iVar17 = *piVar10;
    if ((uVar16 == '\x03') || (uVar16 == '\x02')) {
      if (iVar17 < 1) goto LAB_00106eee;
LAB_00106f03:
      lVar13 = (long)(int)local_40;
      new_begin = local_40 + 1;
      local_38->keys[lVar13] = uVar1;
      local_38->containers[lVar13] = local_48;
      local_38->typecodes[lVar13] = local_51[0];
    }
    else {
      if (iVar17 != 0) {
        if (iVar17 != -1) goto LAB_00106f03;
        lVar13 = 0;
        do {
          if (*(long *)(*(long *)(piVar10 + 2) + lVar13 * 8) != 0) goto LAB_00106f03;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x400);
      }
LAB_00106eee:
      container_free(local_48,local_51[0]);
      new_begin = local_40;
    }
    begin = begin + 1;
    if ((begin == end) || (uVar14 = uVar14 + 1, uVar14 == uVar2)) {
LAB_00106f52:
      if (end - begin != 0 && (int)begin <= (int)end) {
        if ((int)new_begin < (int)begin) {
          ra_copy_range(&x1->high_low_container,begin,end,new_begin);
        }
        new_begin = new_begin + (end - begin);
      }
LAB_00106f79:
      ra_downsize(&x1->high_low_container,new_begin);
      return;
    }
    puVar8 = (x1->high_low_container).keys;
    puVar12 = puVar8 + (begin & 0xffff);
    uVar9 = (x2->high_low_container).keys[uVar14 & 0xffff];
  } while( true );
}

Assistant:

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,
                                   const roaring_bitmap_t *x2) {
    assert(x1 != x2);

    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;
    int intersection_size = 0;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_clear(x1);
        return;
    }

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_andnot(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            } else {
                c = container_iandnot(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size++, s1,
                                                      c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            if (pos1 != intersection_size) {
                container_t *c1 = ra_get_container_at_index(
                    &x1->high_low_container, (uint16_t)pos1, &type1);

                ra_replace_key_and_container_at_index(
                    &x1->high_low_container, intersection_size, s1, c1, type1);
            }
            intersection_size++;
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }

    if (pos1 < length1) {
        // all containers between intersection_size and
        // pos1 are junk.  However, they have either been moved
        // (thus still referenced) or involved in an iandnot
        // that will clean up all containers that could not be reused.
        // Thus we should not free the junk containers between
        // intersection_size and pos1.
        if (pos1 > intersection_size) {
            // left slide of remaining items
            ra_copy_range(&x1->high_low_container, pos1, length1,
                          intersection_size);
        }
        // else current placement is fine
        intersection_size += (length1 - pos1);
    }
    ra_downsize(&x1->high_low_container, intersection_size);
}